

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O0

void __thiscall TPZGeoMesh::Write(TPZGeoMesh *this,TPZStream *buf,int withclassid)

{
  bool bVar1;
  reference ppVar2;
  long *in_RSI;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *in_RDI;
  int vals [3];
  pair<const_std::pair<int,_int>,_int> elem;
  const_iterator __end1;
  const_iterator __begin1;
  InterfaceMaterialsMap *__range1;
  int64_t ninterfacemaps;
  _Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_int>_> *this_00;
  int local_50;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  _Self in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd0;
  size_type local_20 [2];
  long *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x60))(in_RSI,&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,1);
  this_00 = (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_int>_> *)
            (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  TPZPersistenceManager::WritePointer((TPZSavable *)this_00,(TPZStream *)in_RDI);
  TPZStream::WritePointers<TPZGeoEl,10>
            ((TPZStream *)in_stack_ffffffffffffffd0._M_node,
             (TPZAdmChunkVector<TPZGeoEl_*,_10> *)in_stack_ffffffffffffffc8._M_node);
  TPZAdmChunkVector<TPZGeoNode,_10>::Write
            ((TPZAdmChunkVector<TPZGeoNode,_10> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (TPZStream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb4);
  (**(code **)(*local_10 + 0x28))
            (local_10,&in_RDI[0xc]._M_t._M_impl.super__Rb_tree_header._M_header._M_right,1);
  (**(code **)(*local_10 + 0x28))
            (local_10,&in_RDI[0xc]._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
  (**(code **)(*local_10 + 0x18))(local_10,in_RDI + 0xd,1);
  local_20[0] = std::
                map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                ::size((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                        *)0x1a2dd85);
  (**(code **)(*local_10 + 0x28))(local_10,local_20,1);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::begin(in_RDI);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::end(in_RDI);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffffc8
                                ), bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_int>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_int>_> *)
                        0x1a2ddeb);
    local_50 = (ppVar2->first).first;
    (**(code **)(*local_10 + 0x18))(local_10,&local_50,3);
    std::_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_int>_>::operator++(this_00);
  }
  return;
}

Assistant:

void TPZGeoMesh::Write(TPZStream &buf, int withclassid) const { //ok
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        LOGPZ_DEBUG(logger, __PRETTY_FUNCTION__);
    }
#endif
    buf.Write(&fName);
//    if (fReference) {
//        std::cout << __PRETTY_FUNCTION__ << "TPZGeoMesh::Write Trying to write a gmesh with non-null reference. Call ResetReference() and try again." << std::endl;
//        std::cout.flush();
//        DebugStop();
//    }
    TPZPersistenceManager::WritePointer(fReference, &buf);
    buf.WritePointers(fElementVec);
    fNodeVec.Write(buf, withclassid);
    buf.Write(&fNodeMaxId);
    buf.Write(&fElementMaxId);
    buf.Write(&fDim);
    int64_t ninterfacemaps = fInterfaceMaterials.size();
    buf.Write(&ninterfacemaps);
    for (auto elem : fInterfaceMaterials) {
        int vals[3];
        vals[0] = elem.first.first;
        vals[1] = elem.first.second;
        vals[2] = elem.second;
        buf.Write(vals, 3);
    }
}